

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString __thiscall SimpleString::printable(SimpleString *this)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  char *s2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  undefined8 extraout_RDX_01;
  size_t extraout_RDX_02;
  SimpleString *in_RSI;
  SimpleString SVar5;
  undefined1 local_60 [8];
  SimpleString hexEscapeCode;
  ulong uStack_48;
  char c;
  size_t i;
  size_t j;
  size_t str_size;
  SimpleString *this_local;
  SimpleString *result;
  
  SimpleString(this,"");
  sVar3 = getPrintableSize(in_RSI);
  setInternalBufferToNewBuffer(this,sVar3 + 1);
  sVar4 = size(in_RSI);
  i = 0;
  sVar3 = extraout_RDX;
  for (uStack_48 = 0; uStack_48 < sVar4; uStack_48 = uStack_48 + 1) {
    hexEscapeCode.bufferSize_._7_1_ = in_RSI->buffer_[uStack_48];
    bVar2 = isControlWithShortEscapeSequence(hexEscapeCode.bufferSize_._7_1_);
    if (bVar2) {
      StrNCpy(this->buffer_ + i,
              printable::shortEscapeCodes[(int)hexEscapeCode.bufferSize_._7_1_ - 7U & 0xff],2);
      i = i + 2;
      sVar3 = extraout_RDX_00;
    }
    else {
      bVar2 = isControl(hexEscapeCode.bufferSize_._7_1_);
      if (bVar2) {
        StringFromFormat(local_60,"\\x%02X ",(ulong)(uint)(int)hexEscapeCode.bufferSize_._7_1_);
        pcVar1 = this->buffer_;
        s2 = asCharString((SimpleString *)local_60);
        StrNCpy(pcVar1 + i,s2,4);
        i = i + 4;
        ~SimpleString((SimpleString *)local_60);
        sVar3 = extraout_RDX_02;
      }
      else {
        sVar3 = CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),hexEscapeCode.bufferSize_._7_1_);
        this->buffer_[i] = hexEscapeCode.bufferSize_._7_1_;
        i = i + 1;
      }
    }
  }
  this->buffer_[i] = '\0';
  SVar5.bufferSize_ = sVar3;
  SVar5.buffer_ = (char *)this;
  return SVar5;
}

Assistant:

SimpleString SimpleString::printable() const
{
    static const char* shortEscapeCodes[] =
    {
        "\\a",
        "\\b",
        "\\t",
        "\\n",
        "\\v",
        "\\f",
        "\\r"
    };

    SimpleString result;
    result.setInternalBufferToNewBuffer(getPrintableSize() + 1);

    size_t str_size = size();
    size_t j = 0;
    for (size_t i = 0; i < str_size; i++)
    {
        char c = buffer_[i];
        if (isControlWithShortEscapeSequence(c))
        {
            StrNCpy(&result.buffer_[j], shortEscapeCodes[(unsigned char)(c - '\a')], 2);
            j += 2;
        }
        else if (isControl(c))
        {
            SimpleString hexEscapeCode = StringFromFormat("\\x%02X ", c);
            StrNCpy(&result.buffer_[j], hexEscapeCode.asCharString(), 4);
            j += 4;
        }
        else
        {
            result.buffer_[j] = c;
            j++;
        }
    }
    result.buffer_[j] = 0;

    return result;
}